

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_FireWeaponAlt(player_t *player,FState *state)

{
  AWeapon *this;
  bool bVar1;
  int iVar2;
  DBot *pDVar3;
  FState *pFVar4;
  undefined4 extraout_var;
  FName local_1c;
  
  pDVar3 = GC::ReadBarrier<DBot>((DBot **)&player->Bot);
  if (((pDVar3 != (DBot *)0x0) || (bot_observer.Value == false)) &&
     (this = player->ReadyWeapon, this != (AWeapon *)0x0)) {
    local_1c.Index = 0xa1;
    pFVar4 = AActor::FindState((AActor *)this,&local_1c);
    if (pFVar4 != (FState *)0x0) {
      bVar1 = AWeapon::CheckAmmo(this,1,true,false,-1);
      if (bVar1) {
        APlayerPawn::PlayAttacking(player->mo);
        this->bAltFire = true;
        if (state == (FState *)0x0) {
          iVar2 = (*(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject
                    [0x48])(this,(ulong)(player->refire != 0));
          state = (FState *)CONCAT44(extraout_var,iVar2);
        }
        P_SetPsprite(player,PSP_WEAPON,state,false);
        if (((this->super_AInventory).field_0x4dc & 0x10) == 0) {
          P_NoiseAlert(&player->mo->super_AActor,&player->mo->super_AActor,false,0.0);
        }
      }
    }
  }
  return;
}

Assistant:

void P_FireWeaponAlt (player_t *player, FState *state)
{
	AWeapon *weapon;

	// [SO] 9/2/02: People were able to do an awful lot of damage
	// when they were observers...
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}

	weapon = player->ReadyWeapon;
	if (weapon == nullptr || weapon->FindState(NAME_AltFire) == nullptr || !weapon->CheckAmmo (AWeapon::AltFire, true))
	{
		return;
	}

	player->mo->PlayAttacking ();
	weapon->bAltFire = true;

	if (state == nullptr)
	{
		state = weapon->GetAltAtkState(!!player->refire);
	}

	P_SetPsprite(player, PSP_WEAPON, state);
	if (!(weapon->WeaponFlags & WIF_NOALERT))
	{
		P_NoiseAlert (player->mo, player->mo, false);
	}
}